

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_lazy_dedicatedDictSearch_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  seqDef *psVar3;
  bool bVar4;
  char cVar5;
  undefined8 uVar6;
  seqStore_t *psVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  U32 UVar14;
  uint uVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  int *piVar18;
  uint uVar19;
  U32 UVar20;
  U32 UVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int *ip;
  int *piVar25;
  int iVar26;
  BYTE *pBVar27;
  long lVar28;
  size_t ofbCandidate;
  BYTE *litEnd;
  BYTE *litLimit_w;
  size_t local_f8;
  uint local_ec;
  BYTE *local_e8;
  BYTE *local_e0;
  int *local_d8;
  uint local_d0;
  uint local_cc;
  ulong local_c8;
  int *local_c0;
  U32 local_b4;
  ulong local_b0;
  seqStore_t *local_a8;
  int *local_a0;
  BYTE *local_98;
  BYTE *local_90;
  int *local_88;
  BYTE *local_80;
  uint local_74;
  BYTE *local_70;
  U32 *local_68;
  BYTE *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_e0 = (ms->window).base;
  uVar9 = (ms->window).dictLimit;
  local_c8 = (ulong)uVar9;
  local_90 = local_e0 + local_c8;
  local_cc = (ms->cParams).minMatch;
  if (5 < local_cc) {
    local_cc = 6;
  }
  if (local_cc < 5) {
    local_cc = 4;
  }
  local_d0 = (ms->cParams).searchLog;
  local_ec = 6;
  if (local_d0 < 6) {
    local_ec = local_d0;
  }
  if (local_ec < 5) {
    local_ec = 4;
  }
  pZVar2 = ms->dictMatchState;
  local_80 = (pZVar2->window).base;
  local_60 = local_80 + (pZVar2->window).dictLimit;
  local_98 = (pZVar2->window).nextSrc;
  iVar8 = (int)local_98;
  piVar25 = (int *)((ulong)(((int)src - ((int)local_60 + (int)local_90)) + iVar8 == 0) + (long)src);
  UVar21 = *rep;
  UVar14 = rep[1];
  ms->lazySkipping = 0;
  local_a0 = (int *)((long)src + (srcSize - 0x10));
  uVar15 = ms->nextToUpdate;
  uVar24 = (ulong)uVar15;
  uVar19 = ((int)local_a0 - (int)(local_e0 + uVar24)) + 1;
  uVar12 = 8;
  if (uVar19 < 8) {
    uVar12 = uVar19;
  }
  if (local_a0 < local_e0 + uVar24) {
    uVar12 = 0;
  }
  if (uVar15 < uVar12 + uVar15) {
    uVar11 = ms->hashSalt;
    cVar5 = (char)ms->rowHashLog;
    do {
      if (local_cc == 5) {
        uVar22 = *(long *)(local_e0 + uVar24) * -0x30e4432345000000;
LAB_00363df4:
        UVar20 = (U32)((uVar22 ^ uVar11) >> (0x38U - cVar5 & 0x3f));
      }
      else {
        if (local_cc == 6) {
          uVar22 = *(long *)(local_e0 + uVar24) * -0x30e4432340650000;
          goto LAB_00363df4;
        }
        UVar20 = (*(int *)(local_e0 + uVar24) * -0x61c8864f ^ (uint)uVar11) >>
                 (0x18U - cVar5 & 0x1f);
      }
      ms->hashCache[(uint)uVar24 & 7] = UVar20;
      uVar24 = uVar24 + 1;
    } while (uVar12 + uVar15 != uVar24);
  }
  pBVar27 = (BYTE *)(srcSize + (long)src);
  local_d8 = (int *)src;
  local_68 = rep;
  if (piVar25 < local_a0) {
    local_74 = ((int)local_80 - iVar8) + uVar9;
    local_70 = local_80 + -(ulong)local_74;
    local_88 = (int *)(pBVar27 + -0x20);
    iVar13 = (int)local_e0;
    local_48 = (ulong)((1 - uVar9) - iVar13);
    local_50 = (ulong)(uint)-iVar13;
    local_58 = (ulong)((((iVar8 - uVar9) - (int)local_80) - iVar13) + 1);
    local_e8 = pBVar27;
    local_a8 = seqStore;
    do {
      iVar8 = (int)piVar25;
      uVar9 = ((iVar8 - (int)local_e0) - UVar21) + 1;
      piVar18 = (int *)(local_e0 + uVar9);
      if (uVar9 < (uint)local_c8) {
        piVar18 = (int *)(local_80 + (uVar9 - local_74));
      }
      local_b4 = UVar14;
      if ((uVar9 - (uint)local_c8 < 0xfffffffd) && (*piVar18 == *(int *)((long)piVar25 + 1))) {
        pBVar16 = pBVar27;
        if (uVar9 < (uint)local_c8) {
          pBVar16 = local_98;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar25 + 5),(BYTE *)(piVar18 + 1),pBVar27,pBVar16,
                            local_90);
        uVar24 = sVar10 + 4;
      }
      else {
        uVar24 = 0;
      }
      local_f8 = 999999999;
      if (local_cc == 6) {
        if (local_ec == 6) {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                             (ms,(BYTE *)piVar25,pBVar27,&local_f8);
        }
        else if (local_ec == 5) {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                             (ms,(BYTE *)piVar25,pBVar27,&local_f8);
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                             (ms,(BYTE *)piVar25,pBVar27,&local_f8);
        }
      }
      else if (local_cc == 5) {
        if (local_ec == 6) {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                             (ms,(BYTE *)piVar25,pBVar27,&local_f8);
        }
        else if (local_ec == 5) {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                             (ms,(BYTE *)piVar25,pBVar27,&local_f8);
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                             (ms,(BYTE *)piVar25,pBVar27,&local_f8);
        }
      }
      else if (local_ec == 6) {
        uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6(ms,(BYTE *)piVar25,pBVar27,&local_f8)
        ;
      }
      else if (local_ec == 5) {
        uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5(ms,(BYTE *)piVar25,pBVar27,&local_f8)
        ;
      }
      else {
        uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4(ms,(BYTE *)piVar25,pBVar27,&local_f8)
        ;
      }
      uVar22 = uVar24;
      if (uVar24 < uVar11) {
        uVar22 = uVar11;
      }
      if (uVar22 < 4) {
        uVar24 = (long)piVar25 - (long)local_d8;
        piVar25 = (int *)((long)piVar25 + (uVar24 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar24);
        UVar14 = local_b4;
      }
      else {
        local_c0 = piVar25;
        local_b0 = local_f8;
        if (uVar11 <= uVar24) {
          local_b0 = 1;
          local_c0 = (int *)((long)piVar25 + 1);
        }
        local_38 = (ulong)(((int)local_48 + iVar8) - UVar21);
        local_40 = (ulong)(((int)local_50 + iVar8) - UVar21);
        iVar13 = (int)local_58;
        lVar28 = 0;
        do {
          if (local_a0 <= (int *)((long)piVar25 + lVar28)) break;
          ip = (int *)((long)piVar25 + lVar28 + 1);
          iVar26 = (int)lVar28;
          uVar9 = (int)local_40 + iVar26 + 1;
          piVar18 = (int *)(local_e0 + uVar9);
          if (uVar9 < (uint)local_c8) {
            piVar18 = (int *)(local_80 + (iVar26 + ((iVar13 + iVar8) - UVar21)));
          }
          if (((uint)((int)local_38 + iVar26) < 0xfffffffd) && (*piVar18 == *ip)) {
            pBVar27 = local_e8;
            if (uVar9 < (uint)local_c8) {
              pBVar27 = local_98;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)((long)piVar25 + lVar28 + 5),(BYTE *)(piVar18 + 1),local_e8,
                                pBVar27,local_90);
            if (sVar10 < 0xfffffffffffffffc) {
              uVar9 = 0x1f;
              if ((uint)local_b0 != 0) {
                for (; (uint)local_b0 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              if ((int)((uVar9 ^ 0x1f) + (int)uVar22 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
                local_b0 = 1;
                uVar22 = sVar10 + 4;
                local_c0 = ip;
              }
            }
          }
          local_f8 = 999999999;
          if (local_cc == 6) {
            if (local_ec == 6) {
              uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                 (ms,(BYTE *)ip,local_e8,&local_f8);
            }
            else if (local_ec == 5) {
              uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                 (ms,(BYTE *)ip,local_e8,&local_f8);
            }
            else {
              uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                 (ms,(BYTE *)ip,local_e8,&local_f8);
            }
          }
          else if (local_cc == 5) {
            if (local_ec == 6) {
              uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                 (ms,(BYTE *)ip,local_e8,&local_f8);
            }
            else if (local_ec == 5) {
              uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                 (ms,(BYTE *)ip,local_e8,&local_f8);
            }
            else {
              uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                 (ms,(BYTE *)ip,local_e8,&local_f8);
            }
          }
          else if (local_ec == 6) {
            uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6(ms,(BYTE *)ip,local_e8,&local_f8)
            ;
          }
          else if (local_ec == 5) {
            uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5(ms,(BYTE *)ip,local_e8,&local_f8)
            ;
          }
          else {
            uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4(ms,(BYTE *)ip,local_e8,&local_f8)
            ;
          }
          bVar4 = true;
          if (3 < uVar24) {
            uVar9 = 0x1f;
            if ((uint)local_b0 != 0) {
              for (; (uint)local_b0 >> uVar9 == 0; uVar9 = uVar9 - 1) {
              }
            }
            iVar26 = 0x1f;
            if ((uint)local_f8 != 0) {
              for (; (uint)local_f8 >> iVar26 == 0; iVar26 = iVar26 + -1) {
              }
            }
            if ((int)((uVar9 ^ 0x1f) + (int)uVar22 * 4 + -0x1b) < (int)uVar24 * 4 - iVar26) {
              bVar4 = false;
              local_b0 = local_f8;
              uVar22 = uVar24;
              local_c0 = ip;
            }
          }
          lVar28 = lVar28 + 1;
        } while (!bVar4);
        pBVar27 = local_e8;
        UVar20 = UVar21;
        UVar14 = local_b4;
        if (3 < local_b0) {
          uVar24 = (long)local_c0 + (-(long)local_e0 - local_b0) + -0xfffffffd;
          pBVar17 = local_e0;
          pBVar16 = local_90;
          if ((uint)uVar24 < (uint)local_c8) {
            pBVar17 = local_70;
            pBVar16 = local_60;
          }
          if ((local_d8 < local_c0) && (uVar24 = uVar24 & 0xffffffff, pBVar16 < pBVar17 + uVar24)) {
            pBVar17 = pBVar17 + uVar24;
            do {
              piVar25 = (int *)((long)local_c0 + -1);
              pBVar17 = pBVar17 + -1;
              if ((*(BYTE *)piVar25 != *pBVar17) ||
                 (uVar22 = uVar22 + 1, local_c0 = piVar25, piVar25 <= local_d8)) break;
            } while (pBVar16 < pBVar17);
          }
          UVar20 = (int)local_b0 - 3;
          UVar14 = UVar21;
        }
        uVar24 = (long)local_c0 - (long)local_d8;
        if (local_88 < local_c0) {
          ZSTD_safecopyLiterals(local_a8->lit,(BYTE *)local_d8,(BYTE *)local_c0,(BYTE *)local_88);
        }
        else {
          pBVar16 = local_a8->lit;
          uVar6 = *(undefined8 *)(local_d8 + 2);
          *(undefined8 *)pBVar16 = *(undefined8 *)local_d8;
          *(undefined8 *)(pBVar16 + 8) = uVar6;
          if (0x10 < uVar24) {
            pBVar16 = local_a8->lit;
            uVar6 = *(undefined8 *)(local_d8 + 6);
            *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)(local_d8 + 4);
            *(undefined8 *)(pBVar16 + 0x18) = uVar6;
            if (0x20 < (long)uVar24) {
              lVar28 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_d8 + lVar28 + 0x20);
                uVar6 = puVar1[1];
                pBVar17 = pBVar16 + lVar28 + 0x20;
                *(undefined8 *)pBVar17 = *puVar1;
                *(undefined8 *)(pBVar17 + 8) = uVar6;
                puVar1 = (undefined8 *)((long)local_d8 + lVar28 + 0x30);
                uVar6 = puVar1[1];
                *(undefined8 *)(pBVar17 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar17 + 0x18) = uVar6;
                lVar28 = lVar28 + 0x20;
              } while (pBVar17 + 0x20 < pBVar16 + uVar24);
            }
          }
        }
        psVar7 = local_a8;
        local_a8->lit = local_a8->lit + uVar24;
        if (0xffff < uVar24) {
          local_a8->longLengthType = ZSTD_llt_literalLength;
          local_a8->longLengthPos =
               (U32)((ulong)((long)local_a8->sequences - (long)local_a8->sequencesStart) >> 3);
        }
        psVar3 = local_a8->sequences;
        psVar3->litLength = (U16)uVar24;
        psVar3->offBase = (U32)local_b0;
        if (0xffff < uVar22 - 3) {
          local_a8->longLengthType = ZSTD_llt_matchLength;
          local_a8->longLengthPos =
               (U32)((ulong)((long)psVar3 - (long)local_a8->sequencesStart) >> 3);
        }
        psVar3->mlBase = (U16)(uVar22 - 3);
        local_a8->sequences = psVar3 + 1;
        if (ms->lazySkipping != 0) {
          uVar9 = ms->nextToUpdate;
          uVar24 = (ulong)uVar9;
          uVar15 = ((int)local_a0 - (int)(local_e0 + uVar24)) + 1;
          if (7 < uVar15) {
            uVar15 = 8;
          }
          if (local_a0 < local_e0 + uVar24) {
            uVar15 = 0;
          }
          if (uVar9 < uVar15 + uVar9) {
            uVar11 = ms->hashSalt;
            cVar5 = (char)ms->rowHashLog;
            do {
              if (local_cc == 5) {
                uVar23 = *(long *)(local_e0 + uVar24) * -0x30e4432345000000;
LAB_003645d4:
                UVar21 = (U32)((uVar23 ^ uVar11) >> (0x38U - cVar5 & 0x3f));
              }
              else {
                if (local_cc == 6) {
                  uVar23 = *(long *)(local_e0 + uVar24) * -0x30e4432340650000;
                  goto LAB_003645d4;
                }
                UVar21 = (*(int *)(local_e0 + uVar24) * -0x61c8864f ^ (uint)uVar11) >>
                         (0x18U - cVar5 & 0x1f);
              }
              ms->hashCache[(uint)uVar24 & 7] = UVar21;
              uVar24 = uVar24 + 1;
            } while (uVar15 + uVar9 != uVar24);
          }
          ms->lazySkipping = 0;
        }
        piVar25 = (int *)((long)local_c0 + uVar22);
        local_d8 = piVar25;
        do {
          UVar21 = UVar20;
          if (local_a0 < piVar25) break;
          uVar9 = ((int)piVar25 - (int)local_e0) - UVar14;
          pBVar16 = local_e0;
          if (uVar9 < (uint)local_c8) {
            pBVar16 = local_70;
          }
          if ((uVar9 - (uint)local_c8 < 0xfffffffd) && (*(int *)(pBVar16 + uVar9) == *piVar25)) {
            pBVar17 = pBVar27;
            if (uVar9 < (uint)local_c8) {
              pBVar17 = local_98;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)(piVar25 + 1),(BYTE *)((long)(pBVar16 + uVar9) + 4),pBVar27,
                                pBVar17,local_90);
            pBVar16 = psVar7->lit;
            if (local_88 < local_d8) {
              ZSTD_safecopyLiterals(pBVar16,(BYTE *)local_d8,(BYTE *)local_d8,(BYTE *)local_88);
            }
            else {
              uVar6 = *(undefined8 *)(local_d8 + 2);
              *(undefined8 *)pBVar16 = *(undefined8 *)local_d8;
              *(undefined8 *)(pBVar16 + 8) = uVar6;
            }
            psVar3 = psVar7->sequences;
            psVar3->litLength = 0;
            psVar3->offBase = 1;
            if (0xffff < sVar10 + 1) {
              psVar7->longLengthType = ZSTD_llt_matchLength;
              psVar7->longLengthPos =
                   (U32)((ulong)((long)psVar3 - (long)psVar7->sequencesStart) >> 3);
            }
            psVar3->mlBase = (U16)(sVar10 + 1);
            psVar7->sequences = psVar3 + 1;
            piVar25 = (int *)((long)piVar25 + sVar10 + 4);
            bVar4 = true;
            UVar20 = UVar14;
            local_d8 = piVar25;
          }
          else {
            bVar4 = false;
            UVar21 = UVar14;
          }
          UVar14 = UVar21;
          UVar21 = UVar20;
        } while (bVar4);
      }
    } while (piVar25 < local_a0);
  }
  *local_68 = UVar21;
  local_68[1] = UVar14;
  return (long)pBVar27 - (long)local_d8;
}

Assistant:

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_dedicatedDictSearch);
}